

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

IffEventClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IffEventClauseSyntax,slang::parsing::Token&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,Token *args,ExpressionSyntax *args_1)

{
  Token iff;
  IffEventClauseSyntax *pIVar1;
  BumpAllocator *in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pIVar1 = (IffEventClauseSyntax *)
           allocate(in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  iff.info = in_RSI;
  iff._0_8_ = in_RDX;
  slang::syntax::IffEventClauseSyntax::IffEventClauseSyntax
            ((IffEventClauseSyntax *)in_RSI->location,iff,(ExpressionSyntax *)in_RSI->rawTextPtr);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }